

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::javanano::EmptyArrayName_abi_cxx11_
          (string *__return_storage_ptr__,javanano *this,Params *params,FieldDescriptor *field)

{
  JavaType JVar1;
  Params *params_00;
  LogMessage *other;
  uint *descriptor;
  char *pcVar2;
  LogFinisher local_51;
  LogMessage local_50;
  
  JVar1 = GetJavaType((FieldDescriptor *)params);
  descriptor = &switchD_00252053::switchdataD_00346f78;
  switch(JVar1) {
  case JAVATYPE_INT:
  case JAVATYPE_ENUM:
    pcVar2 = "com.google.protobuf.nano.WireFormatNano.EMPTY_INT_ARRAY";
    break;
  case JAVATYPE_LONG:
    pcVar2 = "com.google.protobuf.nano.WireFormatNano.EMPTY_LONG_ARRAY";
    break;
  case JAVATYPE_FLOAT:
    pcVar2 = "com.google.protobuf.nano.WireFormatNano.EMPTY_FLOAT_ARRAY";
    break;
  case JAVATYPE_DOUBLE:
    pcVar2 = "com.google.protobuf.nano.WireFormatNano.EMPTY_DOUBLE_ARRAY";
    break;
  case JAVATYPE_BOOLEAN:
    pcVar2 = "com.google.protobuf.nano.WireFormatNano.EMPTY_BOOLEAN_ARRAY";
    break;
  case JAVATYPE_STRING:
    pcVar2 = "com.google.protobuf.nano.WireFormatNano.EMPTY_STRING_ARRAY";
    break;
  case JAVATYPE_BYTES:
    pcVar2 = "com.google.protobuf.nano.WireFormatNano.EMPTY_BYTES_ARRAY";
    break;
  case JAVATYPE_MESSAGE:
    params_00 = (Params *)FieldDescriptor::message_type((FieldDescriptor *)params);
    ClassName_abi_cxx11_((string *)&local_50,this,params_00,(Descriptor *)descriptor);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
                   ".EMPTY_ARRAY");
    std::__cxx11::string::~string((string *)&local_50);
    return __return_storage_ptr__;
  default:
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/javanano/javanano_helpers.cc"
               ,399);
    other = internal::LogMessage::operator<<(&local_50,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
    pcVar2 = "";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,(allocator *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

string EmptyArrayName(const Params& params, const FieldDescriptor* field) {
  switch (GetJavaType(field)) {
    case JAVATYPE_INT    : return "com.google.protobuf.nano.WireFormatNano.EMPTY_INT_ARRAY";
    case JAVATYPE_LONG   : return "com.google.protobuf.nano.WireFormatNano.EMPTY_LONG_ARRAY";
    case JAVATYPE_FLOAT  : return "com.google.protobuf.nano.WireFormatNano.EMPTY_FLOAT_ARRAY";
    case JAVATYPE_DOUBLE : return "com.google.protobuf.nano.WireFormatNano.EMPTY_DOUBLE_ARRAY";
    case JAVATYPE_BOOLEAN: return "com.google.protobuf.nano.WireFormatNano.EMPTY_BOOLEAN_ARRAY";
    case JAVATYPE_STRING : return "com.google.protobuf.nano.WireFormatNano.EMPTY_STRING_ARRAY";
    case JAVATYPE_BYTES  : return "com.google.protobuf.nano.WireFormatNano.EMPTY_BYTES_ARRAY";
    case JAVATYPE_ENUM   : return "com.google.protobuf.nano.WireFormatNano.EMPTY_INT_ARRAY";
    case JAVATYPE_MESSAGE: return ClassName(params, field->message_type()) + ".EMPTY_ARRAY";

    // No default because we want the compiler to complain if any new
    // JavaTypes are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}